

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O2

void ELFIO::dump::header(ostream *out,elfio *reader)

{
  elf_header *peVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  string asStackY_f8 [4];
  uint in_stack_ffffffffffffff0c;
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  
  peVar1 = (reader->header)._M_t.
           super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
           super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
           super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
  if ((peVar1 != (elf_header *)0x0) && (iVar2 = (*peVar1->_vptr_elf_header[7])(), (short)iVar2 != 0)
     ) {
    poVar4 = std::operator<<(out,"ELF Header");
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(poVar4,"  Class:      ");
    peVar1 = (reader->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
    if (peVar1 != (elf_header *)0x0) {
      (*peVar1->_vptr_elf_header[4])();
    }
    str_class<unsigned_char>((uchar)(in_stack_ffffffffffffff0c >> 0x18));
    poVar4 = std::operator<<(poVar4,local_38);
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(poVar4,"  Encoding:   ");
    peVar1 = (reader->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
    if (peVar1 != (elf_header *)0x0) {
      (*peVar1->_vptr_elf_header[6])();
    }
    str_endian<unsigned_char>((uchar)(in_stack_ffffffffffffff0c >> 0x18));
    poVar4 = std::operator<<(poVar4,local_58);
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(poVar4,"  ELFVersion: ");
    peVar1 = (reader->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
    if (peVar1 != (elf_header *)0x0) {
      (*peVar1->_vptr_elf_header[5])();
    }
    str_version<unsigned_char>((uchar)(in_stack_ffffffffffffff0c >> 0x18));
    poVar4 = std::operator<<(poVar4,local_78);
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(poVar4,"  OS/ABI:     ");
    peVar1 = (reader->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
    if (peVar1 != (elf_header *)0x0) {
      (*peVar1->_vptr_elf_header[0xc])();
    }
    str_os_abi<unsigned_char>((uchar)(in_stack_ffffffffffffff0c >> 0x18));
    poVar4 = std::operator<<(poVar4,local_98);
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(poVar4,"  ABI Version:");
    peVar1 = (reader->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
    if (peVar1 == (elf_header *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (*peVar1->_vptr_elf_header[0xe])();
    }
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar3 & 0xff);
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(poVar4,"  Type:       ");
    peVar1 = (reader->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
    if (peVar1 != (elf_header *)0x0) {
      (*peVar1->_vptr_elf_header[0x10])();
    }
    str_type<unsigned_short>((unsigned_short)(in_stack_ffffffffffffff0c >> 0x10));
    poVar4 = std::operator<<(poVar4,local_b8);
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(poVar4,"  Machine:    ");
    peVar1 = (reader->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
    if (peVar1 != (elf_header *)0x0) {
      (*peVar1->_vptr_elf_header[0x12])();
    }
    str_machine<unsigned_short>((unsigned_short)(in_stack_ffffffffffffff0c >> 0x10));
    poVar4 = std::operator<<(poVar4,local_d8);
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(poVar4,"  Version:    ");
    peVar1 = (reader->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
    if (peVar1 != (elf_header *)0x0) {
      (*peVar1->_vptr_elf_header[10])();
    }
    str_version<unsigned_int>(in_stack_ffffffffffffff0c);
    poVar4 = std::operator<<(poVar4,asStackY_f8);
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(poVar4,"  Entry:      ");
    poVar4 = std::operator<<(poVar4,"0x");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    peVar1 = (reader->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
    if (peVar1 != (elf_header *)0x0) {
      (*peVar1->_vptr_elf_header[0x16])();
    }
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(poVar4,"  Flags:      ");
    poVar4 = std::operator<<(poVar4,"0x");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    peVar1 = (reader->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
    if (peVar1 != (elf_header *)0x0) {
      (*peVar1->_vptr_elf_header[0x14])();
    }
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string(asStackY_f8);
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

static void header( std::ostream& out, const elfio& reader )
    {
        if ( !reader.get_header_size() ) {
            return;
        }
        out << "ELF Header" << std::endl
            << std::endl
            << "  Class:      " << str_class( reader.get_class() ) << std::endl
            << "  Encoding:   " << str_endian( reader.get_encoding() )
            << std::endl
            << "  ELFVersion: " << str_version( reader.get_elf_version() )
            << std::endl
            << "  OS/ABI:     " << str_os_abi( reader.get_os_abi() )
            << std::endl
            << "  ABI Version:" << (int)reader.get_abi_version() << std::endl
            << "  Type:       " << str_type( reader.get_type() ) << std::endl
            << "  Machine:    " << str_machine( reader.get_machine() )
            << std::endl
            << "  Version:    " << str_version( reader.get_version() )
            << std::endl
            << "  Entry:      " << "0x" << std::hex << reader.get_entry()
            << std::endl
            << "  Flags:      " << "0x" << std::hex << reader.get_flags()
            << std::endl
            << std::endl;
    }